

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O0

int SPRKStepSetUseCompensatedSums(void *arkode_mem,int onoff)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int in_ESI;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  ARKodeMem ark_mem_00;
  int local_4;
  
  ark_mem_00 = (ARKodeMem)0x0;
  local_4 = sprkStep_AccessARKODEStepMem
                      ((void *)0x0,(char *)(ulong)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8,(ARKodeSPRKStepMem *)0x197282);
  if (local_4 == 0) {
    if (in_ESI == 0) {
      uRam0000000000000408 = 0;
      pcRam00000000000000a0 = sprkStep_TakeStep;
    }
    else {
      uRam0000000000000408 = 1;
      pcRam00000000000000a0 = sprkStep_TakeStep_Compensated;
      lVar1._0_4_ = ark_mem_00->itol;
      lVar1._4_4_ = ark_mem_00->ritol;
      if (lVar1 == 0) {
        iVar3 = arkAllocVec(ark_mem_00,(N_Vector)(ulong)in_stack_ffffffffffffffd0,
                            (N_Vector *)in_stack_ffffffffffffffc8);
        if (iVar3 == 0) {
          local_4 = -0x14;
        }
        else {
          uVar2._0_4_ = ark_mem_00->itol;
          uVar2._4_4_ = ark_mem_00->ritol;
          N_VConst(0,uVar2);
        }
      }
    }
  }
  return local_4;
}

Assistant:

int SPRKStepSetUseCompensatedSums(void* arkode_mem, sunbooleantype onoff)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (onoff)
  {
    ark_mem->use_compensated_sums = SUNTRUE;
    ark_mem->step                 = sprkStep_TakeStep_Compensated;
    if (!step_mem->yerr)
    {
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(step_mem->yerr)))
      {
        return ARK_MEM_FAIL;
      }
      /* Zero yerr for compensated summation */
      N_VConst(ZERO, step_mem->yerr);
    }
  }
  else
  {
    ark_mem->use_compensated_sums = SUNFALSE;
    ark_mem->step                 = sprkStep_TakeStep;
  }

  return (retval);
}